

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O0

Value * __thiscall flow::IRBuilder::createN2S(IRBuilder *this,Value *rhs,string *name)

{
  LiteralType LVar1;
  long lVar2;
  ConstantValue<long,_(flow::LiteralType)2> *local_e8;
  string local_d0;
  LiteralType local_b0 [5];
  allocator<char> local_99;
  string local_98;
  char local_78 [8];
  char buf [64];
  ConstantInt *i;
  string *name_local;
  Value *rhs_local;
  IRBuilder *this_local;
  
  name_local = (string *)rhs;
  rhs_local = (Value *)this;
  LVar1 = Value::type(rhs);
  if (LVar1 == Number) {
    if (name_local == (string *)0x0) {
      local_e8 = (ConstantValue<long,_(flow::LiteralType)2> *)0x0;
    }
    else {
      local_e8 = (ConstantValue<long,_(flow::LiteralType)2> *)
                 __dynamic_cast(name_local,&Value::typeinfo,
                                &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
    }
    if (local_e8 == (ConstantValue<long,_(flow::LiteralType)2> *)0x0) {
      local_b0[0] = String;
      makeName(&local_d0,this,name);
      this_local = (IRBuilder *)
                   insert<flow::CastInstr,flow::LiteralType,flow::Value*&,std::__cxx11::string>
                             (this,local_b0,(Value **)&name_local,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else {
      lVar2 = ConstantValue<long,_(flow::LiteralType)2>::get(local_e8);
      snprintf(local_78,0x40,"%li",lVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,local_78,&local_99);
      this_local = (IRBuilder *)get(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
    }
    return (Value *)this_local;
  }
  __assert_fail("rhs->type() == LiteralType::Number",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x246,"Value *flow::IRBuilder::createN2S(Value *, const std::string &)");
}

Assistant:

Value* IRBuilder::createN2S(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::Number);

  if (auto i = dynamic_cast<ConstantInt*>(rhs)) {
    char buf[64];
    snprintf(buf, sizeof(buf), "%" PRIi64 "", i->get());
    return get(buf);
  }

  return insert<CastInstr>(LiteralType::String, rhs, makeName(name));
}